

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFile(DescriptorBuilder *this,FileDescriptorProto *proto)

{
  Tables *pTVar1;
  DescriptorPool *pDVar2;
  __type _Var3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int32 iVar7;
  string *psVar8;
  size_type sVar9;
  reference __lhs;
  FileDescriptor *pFVar10;
  SourceCodeInfo *from;
  SourceCodeInfo *pSVar11;
  FileDescriptorTables *pFVar12;
  FileDescriptor **ppFVar13;
  string *__rhs;
  _func_int **pp_Var14;
  void **ppvVar15;
  DescriptorProto *proto_00;
  EnumDescriptorProto *proto_01;
  ServiceDescriptorProto *proto_02;
  FieldDescriptorProto *proto_03;
  FileOptions *orig_options;
  reference options_to_interpret;
  ulong uVar16;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar17;
  __normal_iterator<google::protobuf::(anonymous_namespace)::OptionsToInterpret_*,_std::vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>_>
  local_438;
  __normal_iterator<google::protobuf::(anonymous_namespace)::OptionsToInterpret_*,_std::vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>_>
  local_430;
  iterator iter;
  OptionInterpreter option_interpreter;
  int local_3e0;
  int i_9;
  int i_8;
  int i_7;
  int i_6;
  int32 local_3ac;
  int local_3a8;
  int index_1;
  int i_5;
  int weak_dependency_count;
  int i_4;
  int32 local_374;
  int local_370;
  int index;
  int i_3;
  int public_dependency_count;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  undefined1 local_2e8 [8];
  string message;
  FileDescriptor *dependency;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  _Base_ptr local_280;
  byte local_278;
  _Base_ptr local_270;
  byte local_268;
  int local_25c;
  undefined1 local_258 [4];
  int i_2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seen_dependencies;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  SourceCodeInfo *local_188;
  SourceCodeInfo *info;
  FileDescriptor *result;
  int i_1;
  string error_message;
  int i;
  string local_128;
  undefined1 local_f8 [8];
  FileDescriptorProto existing_proto;
  FileDescriptor *existing_file;
  FileDescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  psVar8 = FileDescriptorProto::name_abi_cxx11_(proto);
  std::__cxx11::string::operator=((string *)&this->filename_,(string *)psVar8);
  existing_proto._200_8_ = DescriptorPool::Tables::FindFile(this->tables_,&this->filename_);
  if ((FileDescriptor *)existing_proto._200_8_ != (FileDescriptor *)0x0) {
    FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_f8);
    FileDescriptor::CopyTo((FileDescriptor *)existing_proto._200_8_,(FileDescriptorProto *)local_f8)
    ;
    MessageLite::SerializeAsString_abi_cxx11_(&local_128,(MessageLite *)local_f8);
    MessageLite::SerializeAsString_abi_cxx11_((string *)&i,(MessageLite *)proto);
    _Var3 = std::operator==(&local_128,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i)
    ;
    std::__cxx11::string::~string((string *)&i);
    std::__cxx11::string::~string((string *)&local_128);
    if (_Var3) {
      this_local = (DescriptorBuilder *)existing_proto._200_8_;
    }
    error_message.field_2._13_3_ = 0;
    error_message.field_2._M_local_buf[0xc] = _Var3;
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_f8);
    if (error_message.field_2._12_4_ != 0) {
      return (FileDescriptor *)this_local;
    }
  }
  for (error_message.field_2._8_4_ = 0; uVar16 = (ulong)(int)error_message.field_2._8_4_,
      sVar9 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->tables_->pending_files_), uVar16 < sVar9;
      error_message.field_2._8_4_ = error_message.field_2._8_4_ + 1) {
    __lhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&this->tables_->pending_files_,(long)(int)error_message.field_2._8_4_);
    psVar8 = FileDescriptorProto::name_abi_cxx11_(proto);
    _Var3 = std::operator==(__lhs,psVar8);
    if (_Var3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&i_1,"File recursively imports itself: ",
                 (allocator<char> *)((long)&result + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&result + 7));
      for (; uVar16 = (ulong)(int)error_message.field_2._8_4_,
          sVar9 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&this->tables_->pending_files_), uVar16 < sVar9;
          error_message.field_2._8_4_ = error_message.field_2._8_4_ + 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&this->tables_->pending_files_,(long)(int)error_message.field_2._8_4_);
        std::__cxx11::string::append((string *)&i_1);
        std::__cxx11::string::append((char *)&i_1);
      }
      FileDescriptorProto::name_abi_cxx11_(proto);
      std::__cxx11::string::append((string *)&i_1);
      psVar8 = FileDescriptorProto::name_abi_cxx11_(proto);
      AddError(this,psVar8,&proto->super_Message,OTHER,(string *)&i_1);
      error_message.field_2._12_4_ = 1;
      std::__cxx11::string::~string((string *)&i_1);
      return (FileDescriptor *)(DescriptorBuilder *)0x0;
    }
  }
  if (this->pool_->fallback_database_ != (DescriptorDatabase *)0x0) {
    pTVar1 = this->tables_;
    psVar8 = FileDescriptorProto::name_abi_cxx11_(proto);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pTVar1->pending_files_,psVar8);
    for (result._0_4_ = 0; iVar6 = (int)result, iVar5 = FileDescriptorProto::dependency_size(proto),
        iVar6 < iVar5; result._0_4_ = (int)result + 1) {
      pTVar1 = this->tables_;
      psVar8 = FileDescriptorProto::dependency_abi_cxx11_(proto,(int)result);
      pFVar10 = DescriptorPool::Tables::FindFile(pTVar1,psVar8);
      if (pFVar10 == (FileDescriptor *)0x0) {
        if (this->pool_->underlay_ != (DescriptorPool *)0x0) {
          pDVar2 = this->pool_->underlay_;
          psVar8 = FileDescriptorProto::dependency_abi_cxx11_(proto,(int)result);
          pFVar10 = DescriptorPool::FindFileByName(pDVar2,psVar8);
          if (pFVar10 != (FileDescriptor *)0x0) goto LAB_002c00cb;
        }
        pDVar2 = this->pool_;
        psVar8 = FileDescriptorProto::dependency_abi_cxx11_(proto,(int)result);
        DescriptorPool::TryFindFileInFallbackDatabase(pDVar2,psVar8);
      }
LAB_002c00cb:
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(&this->tables_->pending_files_);
  }
  DescriptorPool::Tables::AddCheckpoint(this->tables_);
  info = (SourceCodeInfo *)
         DescriptorPool::Tables::Allocate<google::protobuf::FileDescriptor>(this->tables_);
  this->file_ = (FileDescriptor *)info;
  bVar4 = FileDescriptorProto::has_source_code_info(proto);
  if (bVar4) {
    pSVar11 = DescriptorPool::Tables::AllocateMessage<google::protobuf::SourceCodeInfo>
                        (this->tables_,(SourceCodeInfo *)0x0);
    local_188 = pSVar11;
    from = FileDescriptorProto::source_code_info(proto);
    SourceCodeInfo::CopyFrom(pSVar11,from);
    info[3]._unknown_fields_.fields_ =
         (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
         local_188;
  }
  else {
    pSVar11 = SourceCodeInfo::default_instance();
    info[3]._unknown_fields_.fields_ =
         (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
         pSVar11;
  }
  pFVar12 = DescriptorPool::Tables::AllocateFileTables(this->tables_);
  this->file_tables_ = pFVar12;
  *(FileDescriptorTables **)(this->file_ + 0x90) = this->file_tables_;
  bVar4 = FileDescriptorProto::has_name(proto);
  if (!bVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"",&local_1a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"Missing field: FileDescriptorProto.name.",&local_1d1);
    AddError(this,&local_1a8,&proto->super_Message,OTHER,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
  }
  pTVar1 = this->tables_;
  psVar8 = FileDescriptorProto::name_abi_cxx11_(proto);
  psVar8 = DescriptorPool::Tables::AllocateString(pTVar1,psVar8);
  (info->super_Message).super_MessageLite._vptr_MessageLite = (_func_int **)psVar8;
  bVar4 = FileDescriptorProto::has_package(proto);
  if (bVar4) {
    pTVar1 = this->tables_;
    psVar8 = FileDescriptorProto::package_abi_cxx11_(proto);
    psVar8 = DescriptorPool::Tables::AllocateString(pTVar1,psVar8);
    (info->_unknown_fields_).fields_ =
         (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
         psVar8;
  }
  else {
    pTVar1 = this->tables_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"",&local_1f9);
    psVar8 = DescriptorPool::Tables::AllocateString(pTVar1,&local_1f8);
    (info->_unknown_fields_).fields_ =
         (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
         psVar8;
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
  }
  (info->location_).super_RepeatedPtrFieldBase.elements_ = &this->pool_->mutex_;
  bVar4 = DescriptorPool::Tables::AddFile(this->tables_,(FileDescriptor *)info);
  if (bVar4) {
    FileDescriptor::package_abi_cxx11_((FileDescriptor *)info);
    uVar16 = std::__cxx11::string::empty();
    if ((uVar16 & 1) == 0) {
      psVar8 = FileDescriptor::package_abi_cxx11_((FileDescriptor *)info);
      AddPackage(this,psVar8,&proto->super_Message,(FileDescriptor *)info);
    }
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_258);
    iVar6 = FileDescriptorProto::dependency_size(proto);
    (info->location_).super_RepeatedPtrFieldBase.current_size_ = iVar6;
    pTVar1 = this->tables_;
    iVar6 = FileDescriptorProto::dependency_size(proto);
    ppFVar13 = DescriptorPool::Tables::AllocateArray<google::protobuf::FileDescriptor_const*>
                         (pTVar1,iVar6);
    *(FileDescriptor ***)&(info->location_).super_RepeatedPtrFieldBase.total_size_ = ppFVar13;
    for (local_25c = 0; iVar6 = local_25c, iVar5 = FileDescriptorProto::dependency_size(proto),
        iVar6 < iVar5; local_25c = local_25c + 1) {
      psVar8 = FileDescriptorProto::dependency_abi_cxx11_(proto,local_25c);
      pVar17 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_258,psVar8);
      local_280 = (_Base_ptr)pVar17.first._M_node;
      local_278 = pVar17.second;
      local_270 = local_280;
      local_268 = local_278;
      if (((local_278 ^ 0xff) & 1) != 0) {
        psVar8 = FileDescriptorProto::name_abi_cxx11_(proto);
        __rhs = FileDescriptorProto::dependency_abi_cxx11_(proto,local_25c);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &dependency,"Import \"",__rhs);
        std::operator+(&local_2a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &dependency,"\" was listed twice.");
        AddError(this,psVar8,&proto->super_Message,OTHER,&local_2a0);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::__cxx11::string::~string((string *)&dependency);
      }
      pTVar1 = this->tables_;
      psVar8 = FileDescriptorProto::dependency_abi_cxx11_(proto,local_25c);
      message.field_2._8_8_ = DescriptorPool::Tables::FindFile(pTVar1,psVar8);
      if (((FileDescriptor *)message.field_2._8_8_ == (FileDescriptor *)0x0) &&
         (this->pool_->underlay_ != (DescriptorPool *)0x0)) {
        pDVar2 = this->pool_->underlay_;
        psVar8 = FileDescriptorProto::dependency_abi_cxx11_(proto,local_25c);
        message.field_2._8_8_ = DescriptorPool::FindFileByName(pDVar2,psVar8);
      }
      if (message.field_2._8_8_ == 0) {
        if ((this->pool_->allow_unknown_ & 1U) == 0) {
          std::__cxx11::string::string((string *)local_2e8);
          if (this->pool_->fallback_database_ == (DescriptorDatabase *)0x0) {
            psVar8 = FileDescriptorProto::dependency_abi_cxx11_(proto,local_25c);
            std::operator+(&local_328,"Import \"",psVar8);
            std::operator+(&local_308,&local_328,"\" has not been loaded.");
            std::__cxx11::string::operator=((string *)local_2e8,(string *)&local_308);
            std::__cxx11::string::~string((string *)&local_308);
            std::__cxx11::string::~string((string *)&local_328);
          }
          else {
            psVar8 = FileDescriptorProto::dependency_abi_cxx11_(proto,local_25c);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_3
                           ,"Import \"",psVar8);
            std::operator+(&local_348,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_3
                           ,"\" was not found or had errors.");
            std::__cxx11::string::operator=((string *)local_2e8,(string *)&local_348);
            std::__cxx11::string::~string((string *)&local_348);
            std::__cxx11::string::~string((string *)&i_3);
          }
          psVar8 = FileDescriptorProto::name_abi_cxx11_(proto);
          AddError(this,psVar8,&proto->super_Message,OTHER,(string *)local_2e8);
          std::__cxx11::string::~string((string *)local_2e8);
        }
        else {
          psVar8 = FileDescriptorProto::dependency_abi_cxx11_(proto,local_25c);
          message.field_2._8_8_ = NewPlaceholderFile(this,psVar8);
        }
      }
      *(undefined8 *)
       (*(long *)&(info->location_).super_RepeatedPtrFieldBase.total_size_ + (long)local_25c * 8) =
           message.field_2._8_8_;
    }
    index = 0;
    pTVar1 = this->tables_;
    iVar6 = FileDescriptorProto::public_dependency_size(proto);
    pp_Var14 = (_func_int **)DescriptorPool::Tables::AllocateArray<int>(pTVar1,iVar6);
    info[1].super_Message.super_MessageLite._vptr_MessageLite = pp_Var14;
    for (local_370 = 0; iVar6 = local_370,
        iVar5 = FileDescriptorProto::public_dependency_size(proto), iVar6 < iVar5;
        local_370 = local_370 + 1) {
      iVar7 = FileDescriptorProto::public_dependency(proto,local_370);
      local_374 = iVar7;
      if ((iVar7 < 0) || (iVar6 = FileDescriptorProto::dependency_size(proto), iVar6 <= iVar7)) {
        psVar8 = FileDescriptorProto::name_abi_cxx11_(proto);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&i_4,"Invalid public dependency index.",
                   (allocator<char> *)((long)&weak_dependency_count + 3));
        AddError(this,psVar8,&proto->super_Message,OTHER,(string *)&i_4);
        std::__cxx11::string::~string((string *)&i_4);
        std::allocator<char>::~allocator((allocator<char> *)((long)&weak_dependency_count + 3));
      }
      else {
        *(int32 *)((long)info[1].super_Message.super_MessageLite._vptr_MessageLite + (long)index * 4
                  ) = local_374;
        index = index + 1;
      }
    }
    info->_cached_size_ = index;
    std::
    set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::clear(&this->dependencies_);
    for (i_5 = 0; iVar6 = i_5, iVar5 = FileDescriptor::dependency_count((FileDescriptor *)info),
        iVar6 < iVar5; i_5 = i_5 + 1) {
      pFVar10 = FileDescriptor::dependency((FileDescriptor *)info,i_5);
      RecordPublicDependencies(this,pFVar10);
    }
    index_1 = 0;
    pTVar1 = this->tables_;
    iVar6 = FileDescriptorProto::weak_dependency_size(proto);
    ppvVar15 = (void **)DescriptorPool::Tables::AllocateArray<int>(pTVar1,iVar6);
    info[1].location_.super_RepeatedPtrFieldBase.elements_ = ppvVar15;
    for (local_3a8 = 0; iVar6 = local_3a8, iVar5 = FileDescriptorProto::weak_dependency_size(proto),
        iVar6 < iVar5; local_3a8 = local_3a8 + 1) {
      iVar7 = FileDescriptorProto::weak_dependency(proto,local_3a8);
      local_3ac = iVar7;
      if ((iVar7 < 0) || (iVar6 = FileDescriptorProto::dependency_size(proto), iVar6 <= iVar7)) {
        psVar8 = FileDescriptorProto::name_abi_cxx11_(proto);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&i_6,"Invalid weak dependency index.",
                   (allocator<char> *)((long)&i_7 + 3));
        AddError(this,psVar8,&proto->super_Message,OTHER,(string *)&i_6);
        std::__cxx11::string::~string((string *)&i_6);
        std::allocator<char>::~allocator((allocator<char> *)((long)&i_7 + 3));
      }
      else {
        *(int32 *)((long)info[1].location_.super_RepeatedPtrFieldBase.elements_ + (long)index_1 * 4)
             = local_3ac;
        index_1 = index_1 + 1;
      }
    }
    *(int *)&info[1]._unknown_fields_.fields_ = index_1;
    iVar6 = FileDescriptorProto::message_type_size(proto);
    info[1].location_.super_RepeatedPtrFieldBase.current_size_ = iVar6;
    iVar6 = FileDescriptorProto::message_type_size(proto);
    AllocateArray<google::protobuf::Descriptor>
              (this,iVar6,(Descriptor **)&info[1].location_.super_RepeatedPtrFieldBase.total_size_);
    for (i_8 = 0; iVar6 = FileDescriptorProto::message_type_size(proto), i_8 < iVar6; i_8 = i_8 + 1)
    {
      proto_00 = FileDescriptorProto::message_type(proto,i_8);
      BuildMessage(this,proto_00,(Descriptor *)0x0,
                   (Descriptor *)
                   (*(long *)&info[1].location_.super_RepeatedPtrFieldBase.total_size_ +
                   (long)i_8 * 0x78));
    }
    iVar6 = FileDescriptorProto::enum_type_size(proto);
    info[1]._cached_size_ = iVar6;
    iVar6 = FileDescriptorProto::enum_type_size(proto);
    AllocateArray<google::protobuf::EnumDescriptor>(this,iVar6,(EnumDescriptor **)(info + 2));
    for (i_9 = 0; iVar6 = FileDescriptorProto::enum_type_size(proto), i_9 < iVar6; i_9 = i_9 + 1) {
      proto_01 = FileDescriptorProto::enum_type(proto,i_9);
      BuildEnum(this,proto_01,(Descriptor *)0x0,
                (EnumDescriptor *)
                (info[2].super_Message.super_MessageLite._vptr_MessageLite + (long)i_9 * 7));
    }
    iVar6 = FileDescriptorProto::service_size(proto);
    *(int *)&info[2]._unknown_fields_.fields_ = iVar6;
    iVar6 = FileDescriptorProto::service_size(proto);
    AllocateArray<google::protobuf::ServiceDescriptor>
              (this,iVar6,(ServiceDescriptor **)&info[2].location_);
    for (local_3e0 = 0; iVar6 = FileDescriptorProto::service_size(proto), local_3e0 < iVar6;
        local_3e0 = local_3e0 + 1) {
      proto_02 = FileDescriptorProto::service(proto,local_3e0);
      BuildService(this,proto_02,(void *)0x0,
                   (ServiceDescriptor *)
                   (info[2].location_.super_RepeatedPtrFieldBase.elements_ + (long)local_3e0 * 6));
    }
    iVar6 = FileDescriptorProto::extension_size(proto);
    info[2].location_.super_RepeatedPtrFieldBase.current_size_ = iVar6;
    iVar6 = FileDescriptorProto::extension_size(proto);
    AllocateArray<google::protobuf::FieldDescriptor>
              (this,iVar6,
               (FieldDescriptor **)&info[2].location_.super_RepeatedPtrFieldBase.total_size_);
    for (option_interpreter.dynamic_factory_.prototypes_mutex_.mInternal._4_4_ = 0;
        iVar6 = FileDescriptorProto::extension_size(proto),
        option_interpreter.dynamic_factory_.prototypes_mutex_.mInternal._4_4_ < iVar6;
        option_interpreter.dynamic_factory_.prototypes_mutex_.mInternal._4_4_ =
             option_interpreter.dynamic_factory_.prototypes_mutex_.mInternal._4_4_ + 1) {
      proto_03 = FileDescriptorProto::extension
                           (proto,option_interpreter.dynamic_factory_.prototypes_mutex_.mInternal.
                                  _4_4_);
      BuildExtension(this,proto_03,(Descriptor *)0x0,
                     (FieldDescriptor *)
                     (*(long *)&info[2].location_.super_RepeatedPtrFieldBase.total_size_ +
                     (long)option_interpreter.dynamic_factory_.prototypes_mutex_.mInternal._4_4_ *
                     0x78));
    }
    bVar4 = FileDescriptorProto::has_options(proto);
    if (bVar4) {
      orig_options = FileDescriptorProto::options(proto);
      AllocateOptions(this,orig_options,(FileDescriptor *)info);
    }
    else {
      info[2]._cached_size_ = 0;
      info[2]._has_bits_[0] = 0;
    }
    CrossLinkFile(this,(FileDescriptor *)info,proto);
    if ((this->had_errors_ & 1U) == 0) {
      OptionInterpreter::OptionInterpreter((OptionInterpreter *)&iter,this);
      local_430._M_current =
           (OptionsToInterpret *)
           std::
           vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
           ::begin(&this->options_to_interpret_);
      while( true ) {
        local_438._M_current =
             (OptionsToInterpret *)
             std::
             vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
             ::end(&this->options_to_interpret_);
        bVar4 = __gnu_cxx::operator!=(&local_430,&local_438);
        if (!bVar4) break;
        options_to_interpret =
             __gnu_cxx::
             __normal_iterator<google::protobuf::(anonymous_namespace)::OptionsToInterpret_*,_std::vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>_>
             ::operator*(&local_430);
        OptionInterpreter::InterpretOptions((OptionInterpreter *)&iter,options_to_interpret);
        __gnu_cxx::
        __normal_iterator<google::protobuf::(anonymous_namespace)::OptionsToInterpret_*,_std::vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>_>
        ::operator++(&local_430);
      }
      std::
      vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
      ::clear(&this->options_to_interpret_);
      OptionInterpreter::~OptionInterpreter((OptionInterpreter *)&iter);
    }
    if ((this->had_errors_ & 1U) == 0) {
      ValidateFileOptions(this,(FileDescriptor *)info,proto);
    }
    if ((this->had_errors_ & 1U) == 0) {
      DescriptorPool::Tables::ClearLastCheckpoint(this->tables_);
      this_local = (DescriptorBuilder *)info;
    }
    else {
      DescriptorPool::Tables::RollbackToLastCheckpoint(this->tables_);
      this_local = (DescriptorBuilder *)0x0;
    }
    error_message.field_2._12_4_ = 1;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_258);
  }
  else {
    psVar8 = FileDescriptorProto::name_abi_cxx11_(proto);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,"A file with this name is already in the pool.",
               (allocator<char> *)
               ((long)&seen_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    AddError(this,psVar8,&proto->super_Message,OTHER,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&seen_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    DescriptorPool::Tables::RollbackToLastCheckpoint(this->tables_);
    this_local = (DescriptorBuilder *)0x0;
  }
  return (FileDescriptor *)this_local;
}

Assistant:

const FileDescriptor* DescriptorBuilder::BuildFile(
    const FileDescriptorProto& proto) {
  filename_ = proto.name();

  // Check if the file already exists and is identical to the one being built.
  // Note:  This only works if the input is canonical -- that is, it
  //   fully-qualifies all type names, has no UninterpretedOptions, etc.
  //   This is fine, because this idempotency "feature" really only exists to
  //   accomodate one hack in the proto1->proto2 migration layer.
  const FileDescriptor* existing_file = tables_->FindFile(filename_);
  if (existing_file != NULL) {
    // File already in pool.  Compare the existing one to the input.
    FileDescriptorProto existing_proto;
    existing_file->CopyTo(&existing_proto);
    if (existing_proto.SerializeAsString() == proto.SerializeAsString()) {
      // They're identical.  Return the existing descriptor.
      return existing_file;
    }

    // Not a match.  The error will be detected and handled later.
  }

  // Check to see if this file is already on the pending files list.
  // TODO(kenton):  Allow recursive imports?  It may not work with some
  //   (most?) programming languages.  E.g., in C++, a forward declaration
  //   of a type is not sufficient to allow it to be used even in a
  //   generated header file due to inlining.  This could perhaps be
  //   worked around using tricks involving inserting #include statements
  //   mid-file, but that's pretty ugly, and I'm pretty sure there are
  //   some languages out there that do not allow recursive dependencies
  //   at all.
  for (int i = 0; i < tables_->pending_files_.size(); i++) {
    if (tables_->pending_files_[i] == proto.name()) {
      string error_message("File recursively imports itself: ");
      for (; i < tables_->pending_files_.size(); i++) {
        error_message.append(tables_->pending_files_[i]);
        error_message.append(" -> ");
      }
      error_message.append(proto.name());

      AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
               error_message);
      return NULL;
    }
  }

  // If we have a fallback_database_, attempt to load all dependencies now,
  // before checkpointing tables_.  This avoids confusion with recursive
  // checkpoints.
  if (pool_->fallback_database_ != NULL) {
    tables_->pending_files_.push_back(proto.name());
    for (int i = 0; i < proto.dependency_size(); i++) {
      if (tables_->FindFile(proto.dependency(i)) == NULL &&
          (pool_->underlay_ == NULL ||
           pool_->underlay_->FindFileByName(proto.dependency(i)) == NULL)) {
        // We don't care what this returns since we'll find out below anyway.
        pool_->TryFindFileInFallbackDatabase(proto.dependency(i));
      }
    }
    tables_->pending_files_.pop_back();
  }

  // Checkpoint the tables so that we can roll back if something goes wrong.
  tables_->AddCheckpoint();

  FileDescriptor* result = tables_->Allocate<FileDescriptor>();
  file_ = result;

  if (proto.has_source_code_info()) {
    SourceCodeInfo *info = tables_->AllocateMessage<SourceCodeInfo>();
    info->CopyFrom(proto.source_code_info());
    result->source_code_info_ = info;
  } else {
    result->source_code_info_ = &SourceCodeInfo::default_instance();
  }

  file_tables_ = tables_->AllocateFileTables();
  file_->tables_ = file_tables_;

  if (!proto.has_name()) {
    AddError("", proto, DescriptorPool::ErrorCollector::OTHER,
             "Missing field: FileDescriptorProto.name.");
  }

  result->name_ = tables_->AllocateString(proto.name());
  if (proto.has_package()) {
    result->package_ = tables_->AllocateString(proto.package());
  } else {
    // We cannot rely on proto.package() returning a valid string if
    // proto.has_package() is false, because we might be running at static
    // initialization time, in which case default values have not yet been
    // initialized.
    result->package_ = tables_->AllocateString("");
  }
  result->pool_ = pool_;

  // Add to tables.
  if (!tables_->AddFile(result)) {
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "A file with this name is already in the pool.");
    // Bail out early so that if this is actually the exact same file, we
    // don't end up reporting that every single symbol is already defined.
    tables_->RollbackToLastCheckpoint();
    return NULL;
  }
  if (!result->package().empty()) {
    AddPackage(result->package(), proto, result);
  }

  // Make sure all dependencies are loaded.
  set<string> seen_dependencies;
  result->dependency_count_ = proto.dependency_size();
  result->dependencies_ =
    tables_->AllocateArray<const FileDescriptor*>(proto.dependency_size());
  for (int i = 0; i < proto.dependency_size(); i++) {
    if (!seen_dependencies.insert(proto.dependency(i)).second) {
      AddError(proto.name(), proto,
               DescriptorPool::ErrorCollector::OTHER,
               "Import \"" + proto.dependency(i) + "\" was listed twice.");
    }

    const FileDescriptor* dependency = tables_->FindFile(proto.dependency(i));
    if (dependency == NULL && pool_->underlay_ != NULL) {
      dependency = pool_->underlay_->FindFileByName(proto.dependency(i));
    }

    if (dependency == NULL) {
      if (pool_->allow_unknown_) {
        dependency = NewPlaceholderFile(proto.dependency(i));
      } else {
        string message;
        if (pool_->fallback_database_ == NULL) {
          message = "Import \"" + proto.dependency(i) +
                    "\" has not been loaded.";
        } else {
          message = "Import \"" + proto.dependency(i) +
                    "\" was not found or had errors.";
        }
        AddError(proto.name(), proto,
                 DescriptorPool::ErrorCollector::OTHER,
                 message);
      }
    }

    result->dependencies_[i] = dependency;
  }

  // Check public dependencies.
  int public_dependency_count = 0;
  result->public_dependencies_ = tables_->AllocateArray<int>(
      proto.public_dependency_size());
  for (int i = 0; i < proto.public_dependency_size(); i++) {
    // Only put valid public dependency indexes.
    int index = proto.public_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->public_dependencies_[public_dependency_count++] = index;
    } else {
      AddError(proto.name(), proto,
               DescriptorPool::ErrorCollector::OTHER,
               "Invalid public dependency index.");
    }
  }
  result->public_dependency_count_ = public_dependency_count;

  // Build dependency set
  dependencies_.clear();
  for (int i = 0; i < result->dependency_count(); i++) {
    RecordPublicDependencies(result->dependency(i));
  }

  // Check weak dependencies.
  int weak_dependency_count = 0;
  result->weak_dependencies_ = tables_->AllocateArray<int>(
      proto.weak_dependency_size());
  for (int i = 0; i < proto.weak_dependency_size(); i++) {
    int index = proto.weak_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->weak_dependencies_[weak_dependency_count++] = index;
    } else {
      AddError(proto.name(), proto,
               DescriptorPool::ErrorCollector::OTHER,
               "Invalid weak dependency index.");
    }
  }
  result->weak_dependency_count_ = weak_dependency_count;

  // Convert children.
  BUILD_ARRAY(proto, result, message_type, BuildMessage  , NULL);
  BUILD_ARRAY(proto, result, enum_type   , BuildEnum     , NULL);
  BUILD_ARRAY(proto, result, service     , BuildService  , NULL);
  BUILD_ARRAY(proto, result, extension   , BuildExtension, NULL);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  // Note that the following steps must occur in exactly the specified order.

  // Cross-link.
  CrossLinkFile(result, proto);

  // Interpret any remaining uninterpreted options gathered into
  // options_to_interpret_ during descriptor building.  Cross-linking has made
  // extension options known, so all interpretations should now succeed.
  if (!had_errors_) {
    OptionInterpreter option_interpreter(this);
    for (vector<OptionsToInterpret>::iterator iter =
             options_to_interpret_.begin();
         iter != options_to_interpret_.end(); ++iter) {
      option_interpreter.InterpretOptions(&(*iter));
    }
    options_to_interpret_.clear();
  }

  // Validate options.
  if (!had_errors_) {
    ValidateFileOptions(result, proto);
  }

  if (had_errors_) {
    tables_->RollbackToLastCheckpoint();
    return NULL;
  } else {
    tables_->ClearLastCheckpoint();
    return result;
  }
}